

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrape.c
# Opt level: O2

course_results * scrape_html(char *html)

{
  int iVar1;
  course_results *results;
  course *pcVar2;
  course_strings *pcVar3;
  course_strings *pcVar4;
  course_strings *pcVar5;
  course_strings *pcVar6;
  course_strings *pcVar7;
  course_strings *pcVar8;
  course_strings *pcVar9;
  int *piVar10;
  course_strings *pcVar11;
  course_strings *pcVar12;
  size_t sVar13;
  course_strings *local_d8;
  course_strings *local_d0;
  course_strings course_data;
  course_strings *local_50;
  course_strings *local_48;
  size_t i;
  
  results = (course_results *)malloc(0x10);
  if (results != (course_results *)0x0) {
    results->length = 0;
    local_d8 = (course_strings *)malloc(0x208);
    results->courses = (course *)local_d8;
    if (local_d8 == (course_strings *)0x0) {
      free(results);
    }
    else {
      i = 0;
      local_d0 = (course_strings *)0x5;
      sVar13 = 0;
      do {
        if (html[i] == '\0') {
          results->courses = (course *)0x0;
          results->length = 0;
          return results;
        }
        if ((local_d0 <= sVar13 + 1) &&
           (pcVar2 = (course *)realloc(local_d8,(long)local_d0 * 0xd0), pcVar2 != (course *)0x0)) {
          local_d0 = (course_strings *)((long)local_d0 * 2);
          results->courses = pcVar2;
          local_d8 = (course_strings *)pcVar2;
        }
        course_data.course_name = find_next(html,&i,"_lnkbtn_courseTitle",0x12,'>','<');
        if (course_data.course_name == (char *)0x0) break;
        course_data.instructor = find_next(html,&i,"<b>Instructor:",0xd,'>','<');
        if (course_data.instructor == (char *)0x0) {
          local_50 = &course_data;
LAB_00105b62:
          free(local_50->course_name);
          break;
        }
        course_data.units = find_next(html,&i,"<b>Units:",8,'>','<');
        if (course_data.units == (char *)0x0) {
          local_50 = (course_strings *)&course_data.instructor;
          local_d8 = &course_data;
LAB_00105b5a:
          free(local_d8->course_name);
          goto LAB_00105b62;
        }
        course_data.max_enroll = find_next(html,&i,"<b>Max Enroll</b>",0x10,':','<');
        if (course_data.max_enroll == (char *)0x0) {
          local_d8 = (course_strings *)&course_data.instructor;
          local_50 = (course_strings *)&course_data.units;
          pcVar4 = &course_data;
LAB_00105b4c:
          free(pcVar4->course_name);
          goto LAB_00105b5a;
        }
        course_data.pre_requisites = find_next(html,&i,"<b>Prerequisities:",0x11,'>','<');
        if (course_data.pre_requisites == (char *)0x0) {
          pcVar4 = (course_strings *)&course_data.instructor;
          local_d8 = (course_strings *)&course_data.units;
          local_50 = (course_strings *)&course_data.max_enroll;
          pcVar3 = &course_data;
LAB_00105b3b:
          free(pcVar3->course_name);
          goto LAB_00105b4c;
        }
        course_data.final_exam = find_next(html,&i,"<b>Final Exam:",0xd,'>','\n');
        if (course_data.final_exam == (char *)0x0) {
          pcVar3 = (course_strings *)&course_data.instructor;
          pcVar4 = (course_strings *)&course_data.units;
          local_d8 = (course_strings *)&course_data.max_enroll;
          local_50 = (course_strings *)&course_data.pre_requisites;
          pcVar9 = &course_data;
LAB_00105b27:
          free(pcVar9->course_name);
          goto LAB_00105b3b;
        }
        course_data.class_type = find_next(html,&i,"<td",3,'>','<');
        if (course_data.class_type == (char *)0x0) {
          pcVar9 = (course_strings *)&course_data.instructor;
          pcVar3 = (course_strings *)&course_data.units;
          pcVar4 = (course_strings *)&course_data.max_enroll;
          local_d8 = (course_strings *)&course_data.pre_requisites;
          pcVar8 = &course_data;
          local_50 = (course_strings *)&course_data.final_exam;
LAB_00105b10:
          free(pcVar8->course_name);
          goto LAB_00105b27;
        }
        course_data.days = find_next(html,&i,"<td",3,'>','<');
        if (course_data.days == (char *)0x0) {
          pcVar8 = (course_strings *)&course_data.instructor;
          pcVar9 = (course_strings *)&course_data.units;
          pcVar3 = (course_strings *)&course_data.max_enroll;
          pcVar4 = (course_strings *)&course_data.pre_requisites;
          pcVar7 = &course_data;
          local_d8 = (course_strings *)&course_data.final_exam;
          local_50 = (course_strings *)&course_data.class_type;
LAB_00105af6:
          free(pcVar7->course_name);
          goto LAB_00105b10;
        }
        course_data.times = find_next(html,&i,"<td",3,'<','>');
        if (course_data.times == (char *)0x0) {
          pcVar7 = (course_strings *)&course_data.instructor;
          pcVar8 = (course_strings *)&course_data.units;
          pcVar9 = (course_strings *)&course_data.max_enroll;
          pcVar3 = (course_strings *)&course_data.pre_requisites;
          pcVar6 = &course_data;
          pcVar4 = (course_strings *)&course_data.final_exam;
          local_d8 = (course_strings *)&course_data.class_type;
          local_50 = (course_strings *)&course_data.days;
LAB_00105adb:
          free(pcVar6->course_name);
          goto LAB_00105af6;
        }
        course_data.available_seats = find_next(html,&i,"_lbl_seeDetails",0xe,'>','<');
        if (course_data.available_seats == (char *)0x0) {
          pcVar6 = (course_strings *)&course_data.instructor;
          pcVar7 = (course_strings *)&course_data.units;
          pcVar8 = (course_strings *)&course_data.max_enroll;
          pcVar9 = (course_strings *)&course_data.pre_requisites;
          pcVar5 = &course_data;
          pcVar3 = (course_strings *)&course_data.final_exam;
          local_d8 = (course_strings *)&course_data.class_type;
          local_d0 = (course_strings *)&course_data.days;
          local_50 = (course_strings *)&course_data.times;
LAB_00105ab7:
          pcVar4 = local_d8;
          free(pcVar5->course_name);
          local_d8 = local_d0;
          goto LAB_00105adb;
        }
        course_data.course_status = find_next(html,&i,"<font size=1",0xb,'>','<');
        if (course_data.course_status == (char *)0x0) {
          local_50 = (course_strings *)&course_data.available_seats;
          pcVar6 = (course_strings *)&course_data.instructor;
          pcVar7 = (course_strings *)&course_data.units;
          pcVar8 = (course_strings *)&course_data.max_enroll;
          pcVar9 = (course_strings *)&course_data.pre_requisites;
          pcVar5 = &course_data;
          pcVar3 = (course_strings *)&course_data.final_exam;
          local_d8 = (course_strings *)&course_data.class_type;
          local_d0 = (course_strings *)&course_data.days;
          goto LAB_00105ab7;
        }
        course_data.course_id = find_next(html,&i,"<td",3,'>','<');
        if (course_data.course_id == (char *)0x0) {
          pcVar5 = (course_strings *)&course_data.instructor;
          pcVar6 = (course_strings *)&course_data.units;
          pcVar7 = (course_strings *)&course_data.max_enroll;
          pcVar8 = (course_strings *)&course_data.pre_requisites;
          pcVar4 = &course_data;
          pcVar9 = (course_strings *)&course_data.final_exam;
          local_d8 = (course_strings *)&course_data.class_type;
          pcVar12 = (course_strings *)&course_data.days;
          local_48 = (course_strings *)&course_data.available_seats;
          local_50 = (course_strings *)&course_data.course_status;
LAB_00105a83:
          free(pcVar4->course_name);
          local_d0 = local_48;
          pcVar3 = local_d8;
          local_d8 = pcVar12;
          goto LAB_00105ab7;
        }
        course_data.section_number = find_next(html,&i,"<td",3,'>','<');
        if (course_data.section_number == (char *)0x0) {
          pcVar11 = (course_strings *)&course_data.course_id;
          pcVar4 = (course_strings *)&course_data.instructor;
          pcVar5 = (course_strings *)&course_data.units;
          pcVar6 = (course_strings *)&course_data.max_enroll;
          pcVar7 = (course_strings *)&course_data.pre_requisites;
          pcVar3 = &course_data;
          pcVar8 = (course_strings *)&course_data.final_exam;
          local_d8 = (course_strings *)&course_data.class_type;
          local_d0 = (course_strings *)&course_data.days;
          local_48 = (course_strings *)&course_data.available_seats;
          local_50 = (course_strings *)&course_data.course_status;
LAB_00105a3c:
          pcVar12 = local_48;
          pcVar9 = local_d8;
          free(pcVar3->course_name);
          local_d8 = local_d0;
          local_48 = local_50;
          local_50 = pcVar11;
          goto LAB_00105a83;
        }
        course_data.call_number = find_next(html,&i,"<td",3,'>','<');
        if (course_data.call_number == (char *)0x0) {
          free(course_data.course_name);
          pcVar3 = (course_strings *)&course_data.instructor;
          pcVar4 = (course_strings *)&course_data.units;
          pcVar5 = (course_strings *)&course_data.max_enroll;
          pcVar6 = (course_strings *)&course_data.pre_requisites;
          pcVar7 = (course_strings *)&course_data.final_exam;
          pcVar8 = (course_strings *)&course_data.class_type;
          local_d8 = (course_strings *)&course_data.days;
          local_d0 = (course_strings *)&course_data.available_seats;
          local_48 = (course_strings *)&course_data.course_status;
          local_50 = (course_strings *)&course_data.course_id;
          pcVar11 = (course_strings *)&course_data.section_number;
          goto LAB_00105a3c;
        }
        sVar13 = results->length;
        iVar1 = create_course((course *)((long)local_d8 + sVar13 * 0x68),&course_data);
      } while (iVar1 == 0);
      destroy_course_results(results);
      piVar10 = __errno_location();
      *piVar10 = -0x69;
    }
  }
  return (course_results *)0x0;
}

Assistant:

struct course_results *scrape_html(const char *html)
{
	struct course_results *results;
	size_t capacity;
	size_t i;
	int ret;

	results = init_course_results(&capacity);
	if (!results) {
		return NULL;
	}

	i = 0;
	while (html[i]) {
		struct course_strings course_data;
		struct course *course;

		if (results->length + 1 >= capacity) {
			resize_course_results(results, &capacity);
		}

		ret = read_course_data(&course_data, html, &i);
		if (ret) {
			destroy_course_results(results);
			errno = UCRCOURSE_ERR_RESPONSE;
			return NULL;
		}

		course = (struct course *)(&results->courses[results->length]);
		ret = create_course(course, &course_data);
		if (ret) {
			destroy_course_results(results);
			errno = UCRCOURSE_ERR_RESPONSE;
			return NULL;
		}
	}

	/* TEMP */
	results->courses = NULL;
	results->length = 0;

	return results;
}